

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_common_string.c
# Opt level: O0

void test_strscat_1(void)

{
  int iVar1;
  
  cunit_start_test("test_strscat_1");
  strcpy(output_start,"1234");
  strscat(output_start,"123456",output_len);
  cunit_named_check(output[0] == -1,"test_strscat_1",0xa8,"output underflow guard overwritten");
  cunit_named_check(output[0xf] == -1,"test_strscat_1",0xa9,"output overflow guard overwritten");
  iVar1 = strcmp(output_start,"1234123456");
  cunit_named_check(iVar1 == 0,"test_strscat_1",0xab,"bad result: %s",output_start);
  cunit_end_test("test_strscat_1");
  return;
}

Assistant:

static void
test_strscat_1(void) {
  START_TEST();

  strcpy (output_start, "1234");
  strscat (output_start, "123456", output_len);

  CHECK_TRUE(output[0] == (char)-1, "output underflow guard overwritten");
  CHECK_TRUE(output[sizeof(output)-1] == (char)-1, "output overflow guard overwritten");

  CHECK_TRUE(strcmp(output_start, "1234123456") == 0, "bad result: %s", output_start);
  END_TEST();
}